

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_wad.cpp
# Opt level: O0

int __thiscall FWadFileLump::FillCache(FWadFileLump *this)

{
  FileReader *pFVar1;
  int iVar2;
  undefined4 extraout_var;
  char *pcVar3;
  undefined1 local_20e8 [8];
  FileReaderLZSS lzss;
  char *buffer;
  FWadFileLump *this_local;
  
  if (((this->super_FResourceLump).field_0x4c & 1) == 0) {
    iVar2 = (*(((this->super_FResourceLump).Owner)->Reader->super_FileReaderBase).
              _vptr_FileReaderBase[6])();
    if (CONCAT44(extraout_var,iVar2) != 0) {
      (this->super_FResourceLump).Cache =
           (char *)(CONCAT44(extraout_var,iVar2) + (long)this->Position);
      (this->super_FResourceLump).RefCount = -1;
      return -1;
    }
    lzss.Stream.InternalBuffer = (BYTE *)0x0;
  }
  pFVar1 = ((this->super_FResourceLump).Owner)->Reader;
  (*(pFVar1->super_FileReaderBase)._vptr_FileReaderBase[4])(pFVar1,(long)this->Position,0);
  pcVar3 = (char *)operator_new__((long)(this->super_FResourceLump).LumpSize);
  (this->super_FResourceLump).Cache = pcVar3;
  if (((this->super_FResourceLump).field_0x4c & 1) == 0) {
    pFVar1 = ((this->super_FResourceLump).Owner)->Reader;
    (*(pFVar1->super_FileReaderBase)._vptr_FileReaderBase[2])
              (pFVar1,(this->super_FResourceLump).Cache,(long)(this->super_FResourceLump).LumpSize);
  }
  else {
    FileReaderLZSS::FileReaderLZSS
              ((FileReaderLZSS *)local_20e8,((this->super_FResourceLump).Owner)->Reader);
    FileReaderLZSS::Read
              ((FileReaderLZSS *)local_20e8,(this->super_FResourceLump).Cache,
               (long)(this->super_FResourceLump).LumpSize);
    FileReaderLZSS::~FileReaderLZSS((FileReaderLZSS *)local_20e8);
  }
  (this->super_FResourceLump).RefCount = '\x01';
  return 1;
}

Assistant:

int FillCache()
	{
		if(!Compressed)
		{
			const char * buffer = Owner->Reader->GetBuffer();

			if (buffer != NULL)
			{
				// This is an in-memory file so the cache can point directly to the file's data.
				Cache = const_cast<char*>(buffer) + Position;
				RefCount = -1;
				return -1;
			}
		}

		Owner->Reader->Seek(Position, SEEK_SET);
		Cache = new char[LumpSize];

		if(Compressed)
		{
			FileReaderLZSS lzss(*Owner->Reader);
			lzss.Read(Cache, LumpSize);
		}
		else
			Owner->Reader->Read(Cache, LumpSize);

		RefCount = 1;
		return 1;
	}